

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::maybeUnblockFlow(RpcConnectionState *this)

{
  PromiseFulfiller<void> *pPVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_28;
  
  pPVar1 = (this->flowWaiter).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0 && this->callWordsInFlight < this->flowLimit) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    local_28.disposer = (Disposer *)0x0;
    local_28.ptr = (PromiseFulfiller<void> *)0x0;
    kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(this->flowWaiter).ptr,&local_28);
    kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_28);
  }
  return;
}

Assistant:

void maybeUnblockFlow() {
    if (callWordsInFlight < flowLimit) {
      KJ_IF_SOME(w, flowWaiter) {
        w->fulfill();
        flowWaiter = kj::none;
      }
    }
  }